

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O0

string * __thiscall
ritobin::io::write_text_abi_cxx11_
          (string *__return_storage_ptr__,io *this,Bin *bin,vector<char,_std::allocator<char>_> *out
          ,size_t indent_size)

{
  bool bVar1;
  undefined1 local_40 [8];
  BinTextWriter writer;
  size_t indent_size_local;
  vector<char,_std::allocator<char>_> *out_local;
  Bin *bin_local;
  
  writer.writer.indent_size_ = 0;
  local_40 = (undefined1  [8])bin;
  writer.writer.buffer_ = out;
  writer.writer.ident_ = (size_t)out;
  bVar1 = text_write_impl::BinTextWriter::process_bin((BinTextWriter *)local_40,(Bin *)this);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    text_write_impl::BinTextWriter::trace_error_abi_cxx11_
              (__return_storage_ptr__,(BinTextWriter *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string write_text(Bin const& bin, std::vector<char>& out, size_t indent_size) noexcept {
        BinTextWriter writer = { { out, indent_size } };
        if (!writer.process_bin(bin)) {
            return writer.trace_error();
        }
        return {};
    }